

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3WhereEnd(WhereInfo *pWInfo)

{
  byte bVar1;
  ushort uVar2;
  Parse *pParse;
  SrcList *pSVar3;
  sqlite3 *db;
  Vdbe *p;
  WhereLoop *pWVar4;
  Table *pTVar5;
  Index *pIVar6;
  Index *pIVar7;
  bool bVar8;
  u8 uVar9;
  byte bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  Op *pOVar14;
  anon_union_16_2_dad992c1_for_u *paVar15;
  WhereLevel *pWVar16;
  int iVar17;
  uint uVar18;
  u8 *puVar19;
  Index **ppIVar20;
  ulong uVar21;
  uint uVar22;
  
  pParse = pWInfo->pParse;
  pSVar3 = pWInfo->pTabList;
  db = pParse->db;
  p = pParse->pVdbe;
  uVar21 = (ulong)pWInfo->nLevel;
  if (uVar21 != 0) {
    do {
      pWVar16 = pWInfo->a + (uVar21 - 1);
      pWVar4 = pWInfo->a[uVar21 - 1].pWLoop;
      if (pWInfo->a[uVar21 - 1].op == 0xaa) {
        sqlite3VdbeResolveLabel(p,pWVar16->addrCont);
      }
      else {
        iVar12 = 0;
        iVar11 = 0;
        if ((((pWInfo->eDistinct == '\x02') && (uVar21 == pWInfo->nLevel)) &&
            ((pWVar4->wsFlags & 0x200) != 0)) &&
           (pIVar6 = (pWVar4->u).btree.pIndex, iVar12 = iVar11, (pIVar6->field_0x63 & 0x80) != 0)) {
          uVar2 = (pWVar4->u).btree.nIdxCol;
          if ((uVar2 != 0) && (uVar22 = (uint)uVar2, 0x23 < pIVar6->aiRowLogEst[uVar2])) {
            iVar12 = pParse->nMem + 1;
            uVar18 = 0;
            do {
              sqlite3VdbeAddOp3(p,0x5a,pWVar16->iIdxCur,uVar18,iVar12 + uVar18);
              uVar18 = uVar18 + 1;
            } while (uVar22 != uVar18);
            pParse->nMem = pParse->nMem + uVar22 + 1;
            iVar12 = sqlite3VdbeAddOp3(p,(uint)(pWVar16->op != '\x04') * 3 + 0x16,pWVar16->iIdxCur,0
                                       ,iVar12);
            if (p->db->mallocFailed == '\0') {
              pOVar14 = p->aOp;
              pOVar14[iVar12].p4type = -3;
              pOVar14[iVar12].p4.i = uVar22;
            }
            sqlite3VdbeAddOp3(p,0xb,1,pWVar16->p2,0);
          }
        }
        sqlite3VdbeResolveLabel(p,pWVar16->addrCont);
        sqlite3VdbeAddOp3(p,(uint)pWVar16->op,pWVar16->p1,pWVar16->p2,(uint)pWVar16->p3);
        iVar11 = p->nOp;
        if (0 < (long)iVar11) {
          p->aOp[(long)iVar11 + -1].p5 = (ushort)pWVar16->p5;
        }
        if (iVar12 != 0) {
          pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
          if (p->db->mallocFailed == '\0') {
            iVar17 = iVar11 + -1;
            if (-1 < iVar12) {
              iVar17 = iVar12;
            }
            pOVar14 = p->aOp + iVar17;
          }
          pOVar14->p2 = iVar11;
        }
      }
      if (((pWVar4->wsFlags & 0x800) != 0) && (0 < (pWVar16->u).in.nIn)) {
        sqlite3VdbeResolveLabel(p,pWVar16->addrNxt);
        iVar12 = (pWVar16->u).in.nIn;
        if (0 < (long)iVar12) {
          iVar11 = p->nOp;
          uVar9 = p->db->mallocFailed;
          iVar17 = iVar12 + 1;
          puVar19 = &(pWVar16->u).in.aInLoop[(long)iVar12 + -1].eEndLoopOp;
          do {
            pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
            if (uVar9 == '\0') {
              iVar12 = iVar11 + -1;
              if (-2 < *(int *)(puVar19 + -0xc)) {
                iVar12 = *(int *)(puVar19 + -0xc) + 1;
              }
              pOVar14 = p->aOp + iVar12;
            }
            pOVar14->p2 = iVar11;
            if (*puVar19 != 0xaa) {
              iVar12 = *(int *)(puVar19 + -4);
              if ((iVar12 != 0) &&
                 (iVar11 = sqlite3VdbeAddOp3(p,0x1a,pWVar16->iIdxCur,iVar11 + 2,
                                             *(int *)(puVar19 + -8)), p->db->mallocFailed == '\0'))
              {
                pOVar14 = p->aOp;
                pOVar14[iVar11].p4type = -3;
                pOVar14[iVar11].p4.i = iVar12;
              }
              sqlite3VdbeAddOp3(p,(uint)*puVar19,((InLoop *)(puVar19 + -0x10))->iCur,
                                *(int *)(puVar19 + -0xc),0);
              iVar11 = p->nOp;
              uVar9 = p->db->mallocFailed;
            }
            pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
            if (uVar9 == '\0') {
              iVar12 = *(int *)(puVar19 + -0xc);
              if (*(int *)(puVar19 + -0xc) < 1) {
                iVar12 = iVar11;
              }
              pOVar14 = p->aOp + (long)iVar12 + -1;
            }
            pOVar14->p2 = iVar11;
            iVar17 = iVar17 + -1;
            puVar19 = puVar19 + -0x14;
          } while (1 < iVar17);
        }
      }
      sqlite3VdbeResolveLabel(p,pWVar16->addrBrk);
      if (pWVar16->addrSkip != 0) {
        sqlite3VdbeAddOp3(p,0xb,0,pWVar16->addrSkip,0);
        iVar12 = p->nOp;
        if (p->db->mallocFailed == '\0') {
          iVar11 = pWVar16->addrSkip;
          iVar17 = iVar11;
          if (iVar11 < 0) {
            iVar17 = iVar12 + -1;
          }
          pOVar14 = p->aOp;
          iVar13 = iVar11 + -2;
          if (iVar11 < 2) {
            iVar13 = iVar12 + -1;
          }
          pOVar14[iVar17].p2 = iVar12;
          pOVar14 = pOVar14 + iVar13;
        }
        else {
          pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
          DAT_00213820 = iVar12;
        }
        pOVar14->p2 = iVar12;
      }
      if (pWVar16->addrLikeRep != 0) {
        sqlite3VdbeAddOp3(p,0x31,pWVar16->iLikeRepCntr >> 1,pWVar16->addrLikeRep,0);
      }
      if (pWVar16->iLeftJoin != 0) {
        uVar22 = pWVar4->wsFlags;
        iVar12 = sqlite3VdbeAddOp3(p,0x2f,pWVar16->iLeftJoin,0,0);
        if ((uVar22 & 0x40) == 0) {
          sqlite3VdbeAddOp3(p,0x81,pWVar16->iTabCur,0,0);
        }
        if (((uVar22 >> 9 & 1) != 0) ||
           (((uVar22 >> 0xd & 1) != 0 && ((pWVar16->u).pCovidx != (Index *)0x0)))) {
          sqlite3VdbeAddOp3(p,0x81,pWVar16->iIdxCur,0,0);
        }
        if (pWVar16->op == 'B') {
          iVar11 = pWVar16->addrFirst;
          iVar17 = pWVar16->p1;
          iVar13 = 0xc;
        }
        else {
          iVar11 = pWVar16->addrFirst;
          iVar13 = 0xb;
          iVar17 = 0;
        }
        sqlite3VdbeAddOp3(p,iVar13,iVar17,iVar11,0);
        pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
        if (p->db->mallocFailed == '\0') {
          iVar11 = p->nOp + -1;
          if (-1 < iVar12) {
            iVar11 = iVar12;
          }
          pOVar14 = p->aOp + iVar11;
        }
        pOVar14->p2 = p->nOp;
      }
      bVar8 = 1 < (long)uVar21;
      uVar21 = uVar21 - 1;
    } while (bVar8);
  }
  sqlite3VdbeResolveLabel(p,pWInfo->iBreak);
  bVar10 = pWInfo->nLevel;
  if (bVar10 != 0) {
    pWVar16 = pWInfo->a;
    uVar22 = 0;
    do {
      bVar1 = pWVar16->iFrom;
      if ((pSVar3->a[bVar1].fg.field_0x1 & 0x10) == 0) {
        pTVar5 = pSVar3->a[bVar1].pTab;
        uVar18 = pWVar16->pWLoop->wsFlags;
        if ((uVar18 & 0x240) == 0) {
          if ((uVar18 >> 0xd & 1) == 0) goto LAB_001a5d54;
          paVar15 = &pWVar16->u;
        }
        else {
          paVar15 = (anon_union_16_2_dad992c1_for_u *)&(pWVar16->pWLoop->u).btree.pIndex;
        }
        pIVar6 = paVar15->pCovidx;
        if ((pIVar6 != (Index *)0x0) &&
           (((pWInfo->eOnePass == '\0' || ((pIVar6->pTable->tabFlags & 0x20) != 0)) &&
            (db->mallocFailed == '\0')))) {
          iVar12 = p->nOp;
          iVar11 = pWVar16->addrBody;
          pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
          if (p->db->mallocFailed == '\0') {
            iVar17 = iVar12 + -1;
            if (-1 < iVar11) {
              iVar17 = iVar11;
            }
            pOVar14 = p->aOp + iVar17;
          }
          if (iVar11 < iVar12) {
            iVar17 = pWVar16->iTabCur;
            do {
              if (pOVar14->p1 == iVar17) {
                uVar9 = pOVar14->opcode;
                if (uVar9 == '\x15') {
LAB_001a5d26:
                  pOVar14->p1 = pWVar16->iIdxCur;
                }
                else if (uVar9 == 0x80) {
                  pOVar14->p1 = pWVar16->iIdxCur;
                  pOVar14->opcode = 0x87;
                }
                else if (uVar9 == 'Z') {
                  uVar18 = pOVar14->p2;
                  if ((pTVar5->tabFlags & 0x20) != 0) {
                    ppIVar20 = &pTVar5->pIndex;
                    do {
                      pIVar7 = *ppIVar20;
                      ppIVar20 = &pIVar7->pNext;
                    } while ((*(ushort *)&pIVar7->field_0x63 & 3) != 2);
                    uVar18 = (uint)(ushort)pIVar7->aiColumn[(int)uVar18];
                  }
                  if ((ulong)pIVar6->nColumn != 0) {
                    uVar21 = 0;
                    do {
                      if (pIVar6->aiColumn[uVar21] == (short)uVar18) {
                        if (-1 < (short)uVar21) {
                          pOVar14->p2 = (uint)uVar21 & 0x7fff;
                          goto LAB_001a5d26;
                        }
                        break;
                      }
                      uVar21 = uVar21 + 1;
                    } while (pIVar6->nColumn != uVar21);
                  }
                }
              }
              iVar11 = iVar11 + 1;
              pOVar14 = pOVar14 + 1;
            } while (iVar11 != iVar12);
          }
        }
      }
      else {
        translateColumnToCopy
                  (pParse,pWVar16->addrBody,pWVar16->iTabCur,pSVar3->a[bVar1].regResult,0);
        bVar10 = pWInfo->nLevel;
      }
LAB_001a5d54:
      uVar22 = uVar22 + 1;
      pWVar16 = pWVar16 + 1;
    } while (uVar22 < bVar10);
  }
  pParse->nQueryLoop = pWInfo->savedNQueryLoop;
  whereInfoFree(db,pWInfo);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereEnd(WhereInfo *pWInfo){
  Parse *pParse = pWInfo->pParse;
  Vdbe *v = pParse->pVdbe;
  int i;
  WhereLevel *pLevel;
  WhereLoop *pLoop;
  SrcList *pTabList = pWInfo->pTabList;
  sqlite3 *db = pParse->db;

  /* Generate loop termination code.
  */
  VdbeModuleComment((v, "End WHERE-core"));
  for(i=pWInfo->nLevel-1; i>=0; i--){
    int addr;
    pLevel = &pWInfo->a[i];
    pLoop = pLevel->pWLoop;
    if( pLevel->op!=OP_Noop ){
#ifndef SQLITE_DISABLE_SKIPAHEAD_DISTINCT
      int addrSeek = 0;
      Index *pIdx;
      int n;
      if( pWInfo->eDistinct==WHERE_DISTINCT_ORDERED
       && i==pWInfo->nLevel-1  /* Ticket [ef9318757b152e3] 2017-10-21 */
       && (pLoop->wsFlags & WHERE_INDEXED)!=0
       && (pIdx = pLoop->u.btree.pIndex)->hasStat1
       && (n = pLoop->u.btree.nIdxCol)>0
       && pIdx->aiRowLogEst[n]>=36
      ){
        int r1 = pParse->nMem+1;
        int j, op;
        for(j=0; j<n; j++){
          sqlite3VdbeAddOp3(v, OP_Column, pLevel->iIdxCur, j, r1+j);
        }
        pParse->nMem += n+1;
        op = pLevel->op==OP_Prev ? OP_SeekLT : OP_SeekGT;
        addrSeek = sqlite3VdbeAddOp4Int(v, op, pLevel->iIdxCur, 0, r1, n);
        VdbeCoverageIf(v, op==OP_SeekLT);
        VdbeCoverageIf(v, op==OP_SeekGT);
        sqlite3VdbeAddOp2(v, OP_Goto, 1, pLevel->p2);
      }
#endif /* SQLITE_DISABLE_SKIPAHEAD_DISTINCT */
      /* The common case: Advance to the next row */
      sqlite3VdbeResolveLabel(v, pLevel->addrCont);
      sqlite3VdbeAddOp3(v, pLevel->op, pLevel->p1, pLevel->p2, pLevel->p3);
      sqlite3VdbeChangeP5(v, pLevel->p5);
      VdbeCoverage(v);
      VdbeCoverageIf(v, pLevel->op==OP_Next);
      VdbeCoverageIf(v, pLevel->op==OP_Prev);
      VdbeCoverageIf(v, pLevel->op==OP_VNext);
#ifndef SQLITE_DISABLE_SKIPAHEAD_DISTINCT
      if( addrSeek ) sqlite3VdbeJumpHere(v, addrSeek);
#endif
    }else{
      sqlite3VdbeResolveLabel(v, pLevel->addrCont);
    }
    if( pLoop->wsFlags & WHERE_IN_ABLE && pLevel->u.in.nIn>0 ){
      struct InLoop *pIn;
      int j;
      sqlite3VdbeResolveLabel(v, pLevel->addrNxt);
      for(j=pLevel->u.in.nIn, pIn=&pLevel->u.in.aInLoop[j-1]; j>0; j--, pIn--){
        sqlite3VdbeJumpHere(v, pIn->addrInTop+1);
        if( pIn->eEndLoopOp!=OP_Noop ){
          if( pIn->nPrefix ){
            assert( pLoop->wsFlags & WHERE_IN_EARLYOUT );
            sqlite3VdbeAddOp4Int(v, OP_IfNoHope, pLevel->iIdxCur,
                              sqlite3VdbeCurrentAddr(v)+2,
                              pIn->iBase, pIn->nPrefix);
            VdbeCoverage(v);
          }
          sqlite3VdbeAddOp2(v, pIn->eEndLoopOp, pIn->iCur, pIn->addrInTop);
          VdbeCoverage(v);
          VdbeCoverageIf(v, pIn->eEndLoopOp==OP_Prev);
          VdbeCoverageIf(v, pIn->eEndLoopOp==OP_Next);
        }
        sqlite3VdbeJumpHere(v, pIn->addrInTop-1);
      }
    }
    sqlite3VdbeResolveLabel(v, pLevel->addrBrk);
    if( pLevel->addrSkip ){
      sqlite3VdbeGoto(v, pLevel->addrSkip);
      VdbeComment((v, "next skip-scan on %s", pLoop->u.btree.pIndex->zName));
      sqlite3VdbeJumpHere(v, pLevel->addrSkip);
      sqlite3VdbeJumpHere(v, pLevel->addrSkip-2);
    }
#ifndef SQLITE_LIKE_DOESNT_MATCH_BLOBS
    if( pLevel->addrLikeRep ){
      sqlite3VdbeAddOp2(v, OP_DecrJumpZero, (int)(pLevel->iLikeRepCntr>>1),
                        pLevel->addrLikeRep);
      VdbeCoverage(v);
    }
#endif
    if( pLevel->iLeftJoin ){
      int ws = pLoop->wsFlags;
      addr = sqlite3VdbeAddOp1(v, OP_IfPos, pLevel->iLeftJoin); VdbeCoverage(v);
      assert( (ws & WHERE_IDX_ONLY)==0 || (ws & WHERE_INDEXED)!=0 );
      if( (ws & WHERE_IDX_ONLY)==0 ){
        assert( pLevel->iTabCur==pTabList->a[pLevel->iFrom].iCursor );
        sqlite3VdbeAddOp1(v, OP_NullRow, pLevel->iTabCur);
      }
      if( (ws & WHERE_INDEXED) 
       || ((ws & WHERE_MULTI_OR) && pLevel->u.pCovidx) 
      ){
        sqlite3VdbeAddOp1(v, OP_NullRow, pLevel->iIdxCur);
      }
      if( pLevel->op==OP_Return ){
        sqlite3VdbeAddOp2(v, OP_Gosub, pLevel->p1, pLevel->addrFirst);
      }else{
        sqlite3VdbeGoto(v, pLevel->addrFirst);
      }
      sqlite3VdbeJumpHere(v, addr);
    }
    VdbeModuleComment((v, "End WHERE-loop%d: %s", i,
                     pWInfo->pTabList->a[pLevel->iFrom].pTab->zName));
  }

  /* The "break" point is here, just past the end of the outer loop.
  ** Set it.
  */
  sqlite3VdbeResolveLabel(v, pWInfo->iBreak);

  assert( pWInfo->nLevel<=pTabList->nSrc );
  for(i=0, pLevel=pWInfo->a; i<pWInfo->nLevel; i++, pLevel++){
    int k, last;
    VdbeOp *pOp;
    Index *pIdx = 0;
    struct SrcList_item *pTabItem = &pTabList->a[pLevel->iFrom];
    Table *pTab = pTabItem->pTab;
    assert( pTab!=0 );
    pLoop = pLevel->pWLoop;

    /* For a co-routine, change all OP_Column references to the table of
    ** the co-routine into OP_Copy of result contained in a register.
    ** OP_Rowid becomes OP_Null.
    */
    if( pTabItem->fg.viaCoroutine ){
      testcase( pParse->db->mallocFailed );
      translateColumnToCopy(pParse, pLevel->addrBody, pLevel->iTabCur,
                            pTabItem->regResult, 0);
      continue;
    }

#ifdef SQLITE_ENABLE_EARLY_CURSOR_CLOSE
    /* Close all of the cursors that were opened by sqlite3WhereBegin.
    ** Except, do not close cursors that will be reused by the OR optimization
    ** (WHERE_OR_SUBCLAUSE).  And do not close the OP_OpenWrite cursors
    ** created for the ONEPASS optimization.
    */
    if( (pTab->tabFlags & TF_Ephemeral)==0
     && pTab->pSelect==0
     && (pWInfo->wctrlFlags & WHERE_OR_SUBCLAUSE)==0
    ){
      int ws = pLoop->wsFlags;
      if( pWInfo->eOnePass==ONEPASS_OFF && (ws & WHERE_IDX_ONLY)==0 ){
        sqlite3VdbeAddOp1(v, OP_Close, pTabItem->iCursor);
      }
      if( (ws & WHERE_INDEXED)!=0
       && (ws & (WHERE_IPK|WHERE_AUTO_INDEX))==0 
       && pLevel->iIdxCur!=pWInfo->aiCurOnePass[1]
      ){
        sqlite3VdbeAddOp1(v, OP_Close, pLevel->iIdxCur);
      }
    }
#endif

    /* If this scan uses an index, make VDBE code substitutions to read data
    ** from the index instead of from the table where possible.  In some cases
    ** this optimization prevents the table from ever being read, which can
    ** yield a significant performance boost.
    ** 
    ** Calls to the code generator in between sqlite3WhereBegin and
    ** sqlite3WhereEnd will have created code that references the table
    ** directly.  This loop scans all that code looking for opcodes
    ** that reference the table and converts them into opcodes that
    ** reference the index.
    */
    if( pLoop->wsFlags & (WHERE_INDEXED|WHERE_IDX_ONLY) ){
      pIdx = pLoop->u.btree.pIndex;
    }else if( pLoop->wsFlags & WHERE_MULTI_OR ){
      pIdx = pLevel->u.pCovidx;
    }
    if( pIdx
     && (pWInfo->eOnePass==ONEPASS_OFF || !HasRowid(pIdx->pTable))
     && !db->mallocFailed
    ){
      last = sqlite3VdbeCurrentAddr(v);
      k = pLevel->addrBody;
#ifdef SQLITE_DEBUG
      if( db->flags & SQLITE_VdbeAddopTrace ){
        printf("TRANSLATE opcodes in range %d..%d\n", k, last-1);
      }
#endif
      pOp = sqlite3VdbeGetOp(v, k);
      for(; k<last; k++, pOp++){
        if( pOp->p1!=pLevel->iTabCur ) continue;
        if( pOp->opcode==OP_Column
#ifdef SQLITE_ENABLE_OFFSET_SQL_FUNC
         || pOp->opcode==OP_Offset
#endif
        ){
          int x = pOp->p2;
          assert( pIdx->pTable==pTab );
          if( !HasRowid(pTab) ){
            Index *pPk = sqlite3PrimaryKeyIndex(pTab);
            x = pPk->aiColumn[x];
            assert( x>=0 );
          }
          x = sqlite3ColumnOfIndex(pIdx, x);
          if( x>=0 ){
            pOp->p2 = x;
            pOp->p1 = pLevel->iIdxCur;
            OpcodeRewriteTrace(db, k, pOp);
          }
          assert( (pLoop->wsFlags & WHERE_IDX_ONLY)==0 || x>=0 
              || pWInfo->eOnePass );
        }else if( pOp->opcode==OP_Rowid ){
          pOp->p1 = pLevel->iIdxCur;
          pOp->opcode = OP_IdxRowid;
          OpcodeRewriteTrace(db, k, pOp);
        }else if( pOp->opcode==OP_IfNullRow ){
          pOp->p1 = pLevel->iIdxCur;
          OpcodeRewriteTrace(db, k, pOp);
        }
      }
#ifdef SQLITE_DEBUG
      if( db->flags & SQLITE_VdbeAddopTrace ) printf("TRANSLATE complete\n");
#endif
    }
  }

  /* Final cleanup
  */
  pParse->nQueryLoop = pWInfo->savedNQueryLoop;
  whereInfoFree(db, pWInfo);
  return;
}